

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O0

void do_listoffer(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  long lVar2;
  tm *__tp;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  char *in_RSI;
  long in_RDI;
  string buffer;
  long ttime;
  int argnum;
  int i;
  int status;
  bool found;
  bool autol;
  char arg2 [4608];
  char arg1 [4608];
  char result [200];
  char buf [4608];
  char query [4608];
  MYSQL_ROW row;
  MYSQL_RES *res_set;
  char *in_stack_ffffffffffffb558;
  char *in_stack_ffffffffffffb560;
  CHAR_DATA *in_stack_ffffffffffffb568;
  undefined4 in_stack_ffffffffffffb570;
  undefined1 in_stack_ffffffffffffb574;
  char in_stack_ffffffffffffb575;
  char in_stack_ffffffffffffb576;
  char in_stack_ffffffffffffb577;
  char *local_4a78;
  char *local_4a70;
  char (*local_4a10 [2]) [4608];
  string local_4a00 [32];
  long local_49e0;
  uint local_49d8;
  uint local_49d4;
  uint local_49d0;
  byte local_49ca;
  byte local_49c9;
  char local_49c8 [392];
  format_args in_stack_ffffffffffffb7c0;
  string_view in_stack_ffffffffffffb7d0;
  char *local_37c8 [576];
  char local_25c8 [208];
  char local_24f8 [4608];
  char local_12f8 [4608];
  long local_f8;
  MYSQL_RES *local_f0;
  char *local_e8;
  long local_e0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char[4608]>
  local_d8;
  undefined8 local_b8;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char[4608]>
  *local_b0;
  char (*local_a8) [4608];
  size_t local_a0;
  char **local_98;
  v9 *local_90;
  char (*local_88) [4608];
  size_t sStack_80;
  string *local_78;
  char *local_70;
  char (**local_68) [4608];
  char *local_60;
  char (**local_58) [4608];
  char (**local_50) [4608];
  char (*local_48) [4608];
  size_t sStack_40;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char[4608]>
  *local_38;
  undefined8 *local_30;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char[4608]>
  *local_28;
  undefined8 local_20;
  undefined8 *local_18;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char[4608]>
  *local_10;
  char *local_8;
  
  local_49c9 = 0;
  local_49ca = 0;
  local_49d4 = 1;
  local_e8 = in_RSI;
  local_e0 = in_RDI;
  bVar1 = str_cmp(in_RSI,"auto");
  if (!bVar1) {
    local_49c9 = 1;
  }
  pcVar4 = "";
  if ((local_49c9 & 1) != 0) {
    pcVar4 = "AND status = 0";
  }
  sprintf(local_12f8,"SELECT * FROM offerings WHERE deity = \"%s\" %s ORDER BY time ASC",
          *(undefined8 *)(local_e0 + 0xf0),pcVar4);
  local_f0 = one_query_res(in_stack_ffffffffffffb560);
  if (((local_49c9 & 1) == 0) || (lVar2 = mysql_num_rows(local_f0), lVar2 != 0)) {
    if ((local_49c9 & 1) == 0) {
      pcVar4 = strstr(local_e8,"accept");
      if ((pcVar4 == (char *)0x0) && (pcVar4 = strstr(local_e8,"reject"), pcVar4 == (char *)0x0)) {
        bVar1 = is_number(in_stack_ffffffffffffb558);
        if (bVar1) {
          local_49d8 = atoi(local_e8);
          do {
            local_f8 = mysql_fetch_row(local_f0);
            if (local_f8 == 0) goto LAB_00659740;
            uVar3 = local_49d4 + 1;
            bVar1 = (int)local_49d4 < (int)local_49d8;
            local_49d4 = uVar3;
          } while ((bVar1) || ((int)local_49d8 < 1));
          local_49d0 = atoi(*(char **)(local_f8 + 0x20));
          local_49e0 = atol(*(char **)(local_f8 + 0x28));
          __tp = localtime(&local_49e0);
          strftime(local_25c8,200,"%a %b %d, %l:%M%P",__tp);
          if (local_49d0 == 0) {
            local_4a70 = "New";
          }
          else {
            if (local_49d0 == 1) {
              local_4a78 = "Rejected";
            }
            else {
              local_4a78 = "";
              if (local_49d0 == 2) {
                local_4a78 = "Approved";
              }
            }
            local_4a70 = local_4a78;
          }
          sprintf(local_24f8,
                  "Offering %d:\n\rFrom: %s\n\rTime: %s\n\rStatus: %s\n\rOffering is %s (Vnum %s)\n\r"
                  ,(ulong)local_49d8,*(undefined8 *)(local_f8 + 0x18),local_25c8,local_4a70,
                  *(undefined8 *)(local_f8 + 0x10),*(undefined8 *)(local_f8 + 8));
          send_to_char((char *)CONCAT17(in_stack_ffffffffffffb577,
                                        CONCAT16(in_stack_ffffffffffffb576,
                                                 CONCAT15(in_stack_ffffffffffffb575,
                                                          CONCAT14(in_stack_ffffffffffffb574,
                                                                   in_stack_ffffffffffffb570)))),
                       in_stack_ffffffffffffb568);
          local_49ca = 1;
LAB_00659740:
          mysql_free_result(local_f0);
          if ((local_49ca & 1) == 0) {
            send_to_char((char *)CONCAT17(in_stack_ffffffffffffb577,
                                          CONCAT16(in_stack_ffffffffffffb576,
                                                   CONCAT15(in_stack_ffffffffffffb575,
                                                            CONCAT14(in_stack_ffffffffffffb574,
                                                                     in_stack_ffffffffffffb570)))),
                         in_stack_ffffffffffffb568);
          }
        }
        else {
          send_to_char((char *)CONCAT17(in_stack_ffffffffffffb577,
                                        CONCAT16(in_stack_ffffffffffffb576,
                                                 CONCAT15(in_stack_ffffffffffffb575,
                                                          CONCAT14(in_stack_ffffffffffffb574,
                                                                   in_stack_ffffffffffffb570)))),
                       in_stack_ffffffffffffb568);
          while (local_f8 = mysql_fetch_row(local_f0), local_f8 != 0) {
            local_49d0 = atoi(*(char **)(local_f8 + 0x20));
            if (local_49d0 == 0) {
              in_stack_ffffffffffffb577 = 'N';
            }
            else if (local_49d0 == 1) {
              in_stack_ffffffffffffb576 = 'R';
              in_stack_ffffffffffffb577 = 'R';
            }
            else {
              in_stack_ffffffffffffb574 = 0x20;
              in_stack_ffffffffffffb575 = 'A';
              in_stack_ffffffffffffb576 = in_stack_ffffffffffffb575;
              in_stack_ffffffffffffb577 = in_stack_ffffffffffffb575;
              if (local_49d0 != 2) {
                in_stack_ffffffffffffb575 = ' ';
                in_stack_ffffffffffffb576 = in_stack_ffffffffffffb575;
                in_stack_ffffffffffffb577 = in_stack_ffffffffffffb575;
              }
            }
            uVar5 = (ulong)local_49d4;
            local_49d4 = local_49d4 + 1;
            sprintf(local_24f8,"[%3i%c]  %s offered %s\n\r",uVar5,
                    (ulong)(uint)(int)in_stack_ffffffffffffb577,*(undefined8 *)(local_f8 + 0x18),
                    *(undefined8 *)(local_f8 + 0x10));
            send_to_char((char *)CONCAT17(in_stack_ffffffffffffb577,
                                          CONCAT16(in_stack_ffffffffffffb576,
                                                   CONCAT15(in_stack_ffffffffffffb575,
                                                            CONCAT14(in_stack_ffffffffffffb574,
                                                                     in_stack_ffffffffffffb570)))),
                         in_stack_ffffffffffffb568);
            local_49ca = 1;
          }
          if ((local_49ca & 1) == 0) {
            send_to_char((char *)CONCAT17(in_stack_ffffffffffffb577,
                                          CONCAT16(in_stack_ffffffffffffb576,
                                                   CONCAT15(in_stack_ffffffffffffb575,
                                                            CONCAT14(in_stack_ffffffffffffb574,
                                                                     in_stack_ffffffffffffb570)))),
                         in_stack_ffffffffffffb568);
          }
          send_to_char((char *)CONCAT17(in_stack_ffffffffffffb577,
                                        CONCAT16(in_stack_ffffffffffffb576,
                                                 CONCAT15(in_stack_ffffffffffffb575,
                                                          CONCAT14(in_stack_ffffffffffffb574,
                                                                   in_stack_ffffffffffffb570)))),
                       in_stack_ffffffffffffb568);
          mysql_free_result(local_f0);
        }
      }
      else {
        local_e8 = one_argument(in_stack_ffffffffffffb560,in_stack_ffffffffffffb558);
        local_e8 = one_argument(in_stack_ffffffffffffb560,in_stack_ffffffffffffb558);
        local_49d8 = atoi(local_49c8);
        do {
          local_f8 = mysql_fetch_row(local_f0);
          if (local_f8 == 0) goto LAB_00659546;
          uVar3 = local_49d4 + 1;
          bVar1 = (int)local_49d4 < (int)local_49d8;
          local_49d4 = uVar3;
        } while ((bVar1) || ((int)local_49d8 < 1));
        bVar1 = str_cmp((char *)local_37c8,"reject");
        if (bVar1) {
          local_49d0 = 2;
        }
        else {
          local_49d0 = 1;
        }
        sprintf(local_12f8,"UPDATE offerings SET status=%i WHERE time=%s AND player=\'%s\'",
                (ulong)local_49d0,*(undefined8 *)(local_f8 + 0x28),*(undefined8 *)(local_f8 + 0x18))
        ;
        one_query(in_stack_ffffffffffffb560);
        local_68 = local_4a10;
        local_70 = "{}\'s offering has been {}ed.\n\r";
        local_60 = "{}\'s offering has been {}ed.\n\r";
        local_4a10[0] = (char (*) [4608])0x7eff57;
        local_58 = local_68;
        local_a0 = std::char_traits<char>::length((char_type *)0x659368);
        local_8 = local_70;
        local_90 = (v9 *)(local_f8 + 0x18);
        local_78 = local_4a00;
        local_88 = local_4a10[0];
        local_98 = local_37c8;
        local_50 = &local_88;
        local_a8 = local_4a10[0];
        sStack_80 = local_a0;
        local_48 = local_a8;
        sStack_40 = local_a0;
        fmt::v9::
        make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char*&,char(&)[4608]>
                  (&local_d8,local_90,local_98,local_4a10[0]);
        local_30 = &local_b8;
        local_20 = 0xcc;
        local_b8 = 0xcc;
        local_38 = &local_d8;
        local_28 = &local_d8;
        local_18 = local_30;
        local_10 = &local_d8;
        local_b0 = &local_d8;
        fmt::v9::vformat_abi_cxx11_(in_stack_ffffffffffffb7d0,in_stack_ffffffffffffb7c0);
        std::__cxx11::string::c_str();
        send_to_char((char *)CONCAT17(in_stack_ffffffffffffb577,
                                      CONCAT16(in_stack_ffffffffffffb576,
                                               CONCAT15(in_stack_ffffffffffffb575,
                                                        CONCAT14(in_stack_ffffffffffffb574,
                                                                 in_stack_ffffffffffffb570)))),
                     in_stack_ffffffffffffb568);
        local_49ca = 1;
        std::__cxx11::string::~string(local_4a00);
LAB_00659546:
        if ((local_49ca & 1) == 0) {
          send_to_char((char *)CONCAT17(in_stack_ffffffffffffb577,
                                        CONCAT16(in_stack_ffffffffffffb576,
                                                 CONCAT15(in_stack_ffffffffffffb575,
                                                          CONCAT14(in_stack_ffffffffffffb574,
                                                                   in_stack_ffffffffffffb570)))),
                       in_stack_ffffffffffffb568);
        }
        mysql_free_result(local_f0);
      }
    }
    else {
      mysql_free_result(local_f0);
      send_to_char((char *)CONCAT17(in_stack_ffffffffffffb577,
                                    CONCAT16(in_stack_ffffffffffffb576,
                                             CONCAT15(in_stack_ffffffffffffb575,
                                                      CONCAT14(in_stack_ffffffffffffb574,
                                                               in_stack_ffffffffffffb570)))),
                   in_stack_ffffffffffffb568);
    }
  }
  else {
    mysql_free_result(local_f0);
  }
  return;
}

Assistant:

void do_listoffer(CHAR_DATA *ch, char *argument)
{
	MYSQL_RES *res_set;
	MYSQL_ROW row;
	char query[MSL], buf[MSL], result[200], arg1[MSL], arg2[MSL];
	bool autol= false, found= false;
	int status, i = 1, argnum;
	long ttime;

	if (!str_cmp(argument, "auto"))
		autol = true;

	sprintf(query, "SELECT * FROM offerings WHERE deity = \"%s\" %s ORDER BY time ASC",
		ch->true_name,
		autol ? "AND status = 0" : "");

	res_set = one_query_res(query);

	if (autol && !mysql_num_rows(res_set))
	{
		mysql_free_result(res_set);
		return;
	}
	else if (autol)
	{
		mysql_free_result(res_set);
		
		send_to_char("You have unviewed offerings in your shrine.\n\r", ch);		
		return;
	}

	if (strstr(argument, "accept") || strstr(argument, "reject"))
	{
		argument = one_argument(argument, arg1);
		argument = one_argument(argument, arg2);
		argnum = atoi(arg2);

		while ((row = mysql_fetch_row(res_set)))
		{
			if (i++ < argnum || argnum < 1)
				continue;

			if (!str_cmp(arg1, "reject"))
				status = 1;
			else
				status = 2;

			sprintf(query, "UPDATE offerings SET status=%i WHERE time=%s AND player='%s'", status, row[5], row[3]);
			one_query(query);

			auto buffer = fmt::format("{}'s offering has been {}ed.\n\r", row[3], arg1); //TODO: change the rest of the sprintf calls to format
			send_to_char(buffer.c_str(), ch);

			found = true;
			break;
		}

		if (!found)
			send_to_char("That offering wasn't found.\n\r", ch);

		mysql_free_result(res_set);
		return;
	}

	if (is_number(argument))
	{
		argnum = atoi(argument);
		while ((row = mysql_fetch_row(res_set)))
		{
			if (i++ < argnum || argnum < 1)
				continue;

			status = atoi(row[4]);
			ttime = atol(row[5]);

			strftime(result, 200, "%a %b %d, %l:%M%P", localtime(&ttime));
			sprintf(buf, "Offering %d:\n\rFrom: %s\n\rTime: %s\n\rStatus: %s\n\rOffering is %s (Vnum %s)\n\r",
				argnum,
				row[3],
				result,
				status == 0 ? "New" : status == 1 ? "Rejected" : status == 2 ? "Approved" : "",
				row[2],
				row[1]);
			send_to_char(buf, ch);

			found = true;
			break;
		}

		mysql_free_result(res_set);

		if (!found)
			send_to_char("You have no offerings by that number.\n\r", ch);

		return;
	}

	send_to_char("Offering listing:\n\r", ch);

	while ((row = mysql_fetch_row(res_set)))
	{
		status = atoi(row[4]);
		sprintf(buf, "[%3i%c]  %s offered %s\n\r", i++, status == 0 ? 'N' : status == 1 ? 'R' : status == 2 ? 'A' : ' ', row[3], row[2]);
		send_to_char(buf, ch);
		found = true;
	}

	if (!found)
		send_to_char("There are currently no offerings to you.\n\r", ch);

	send_to_char("Use listoffer <number> to view an offering, and listoffer accept/reject <number> to accept it or not.\n\r", ch);
	mysql_free_result(res_set);
}